

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cc
# Opt level: O0

optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
* hmi::anon_unknown_0::translate_event(Uint32 window_id,SDL_Event *event)

{
  int iVar1;
  optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
  *this;
  int *in_RDX;
  int in_ESI;
  optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
  *in_RDI;
  mouse_moved data_7;
  mouse_button_released data_6;
  mouse_button_pressed data_5;
  mouse_wheel_scrolled data_4;
  keyboard_key_released data_3;
  keyboard_key_repeated data_2;
  keyboard_key_pressed data_1;
  resized data;
  closed *in_stack_ffffffffffffff58;
  optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
  *in_stack_ffffffffffffff60;
  vec_accessor<int,_2UL,_0UL> local_80;
  mouse_button local_74;
  vec_accessor<int,_2UL,_0UL> vStack_70;
  mouse_button local_64;
  vec_accessor<int,_2UL,_0UL> vStack_60;
  vec_accessor<int,_2UL,_0UL> local_54;
  int local_48;
  int local_44;
  keyboard_modifiers local_40;
  int local_3c;
  int local_38;
  keyboard_modifiers local_34;
  int local_30;
  int local_2c;
  keyboard_modifiers local_28;
  vec_accessor<int,_2UL,_0UL> local_1c;
  int *local_10;
  
  iVar1 = *in_RDX;
  if (iVar1 == 0x100) {
    std::
    optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
    ::optional<hmi::window_events::closed,_true>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  else {
    local_10 = in_RDX;
    if (iVar1 == 0x200) {
      if (in_ESI == in_RDX[2]) {
        this = (optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
                *)(ulong)(*(byte *)(in_RDX + 3) - 6);
        switch(this) {
        case (optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
              *)0x0:
          window_events::resized::resized((resized *)0x107035);
          vec_accessor<int,_2UL,_0UL>::operator=(&local_1c,local_10[4]);
          vec_accessor<int,_2UL,_1UL>::operator=
                    ((vec_accessor<int,_2UL,_1UL> *)&local_1c,local_10[5]);
          std::
          optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
          ::optional<hmi::window_events::resized,_true>(this,(resized *)in_stack_ffffffffffffff58);
          break;
        default:
          std::
          optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
          ::optional(in_RDI);
          break;
        case (optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
              *)0x4:
          std::
          optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
          ::optional<hmi::window_events::mouse_entered,_true>
                    (this,(mouse_entered *)in_stack_ffffffffffffff58);
          break;
        case (optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
              *)0x5:
          std::
          optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
          ::optional<hmi::window_events::mouse_left,_true>
                    (this,(mouse_left *)in_stack_ffffffffffffff58);
          break;
        case (optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
              *)0x6:
          std::
          optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
          ::optional<hmi::window_events::focus_gained,_true>
                    (this,(focus_gained *)in_stack_ffffffffffffff58);
          break;
        case (optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
              *)0x7:
          std::
          optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
          ::optional<hmi::window_events::focus_lost,_true>
                    (this,(focus_lost *)in_stack_ffffffffffffff58);
          break;
        case (optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
              *)0x8:
          std::
          optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
          ::optional<hmi::window_events::closed,_true>(this,in_stack_ffffffffffffff58);
        }
      }
      else {
        std::
        optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
        ::optional(in_RDI);
      }
    }
    else if (iVar1 == 0x300) {
      if ((char)in_RDX[3] != '\x01') {
        __assert_fail("event.key.state == SDL_PRESSED",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jube[P]std_hmi/src/window.cc"
                      ,0x11a,
                      "std::optional<window_event> hmi::(anonymous namespace)::translate_event(Uint32, const SDL_Event &)"
                     );
      }
      if (*(char *)((long)in_RDX + 0xd) == '\0') {
        local_30 = in_RDX[5];
        local_2c = in_RDX[4];
        local_28 = compute_keyboard_modifiers(0);
        std::
        optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
        ::optional<hmi::window_events::keyboard_key_pressed,_true>
                  (in_stack_ffffffffffffff60,(keyboard_key_pressed *)in_stack_ffffffffffffff58);
      }
      else {
        local_3c = in_RDX[5];
        local_38 = in_RDX[4];
        local_34 = compute_keyboard_modifiers(0);
        std::
        optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
        ::optional<hmi::window_events::keyboard_key_repeated,_true>
                  (in_stack_ffffffffffffff60,(keyboard_key_repeated *)in_stack_ffffffffffffff58);
      }
    }
    else if (iVar1 == 0x301) {
      if ((char)in_RDX[3] != '\0') {
        __assert_fail("event.key.state == SDL_RELEASED",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jube[P]std_hmi/src/window.cc"
                      ,0x12d,
                      "std::optional<window_event> hmi::(anonymous namespace)::translate_event(Uint32, const SDL_Event &)"
                     );
      }
      local_48 = in_RDX[5];
      local_44 = in_RDX[4];
      local_40 = compute_keyboard_modifiers(0);
      std::
      optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
      ::optional<hmi::window_events::keyboard_key_released,_true>
                (in_stack_ffffffffffffff60,(keyboard_key_released *)in_stack_ffffffffffffff58);
    }
    else if (iVar1 == 0x400) {
      if (in_RDX[3] == -1) {
        std::
        optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
        ::optional(in_RDI);
      }
      else {
        window_events::mouse_moved::mouse_moved((mouse_moved *)0x107450);
        vec_accessor<int,_2UL,_0UL>::operator=(&local_80,local_10[5]);
        vec_accessor<int,_2UL,_1UL>::operator=((vec_accessor<int,_2UL,_1UL> *)&local_80,local_10[6])
        ;
        std::
        optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
        ::optional<hmi::window_events::mouse_moved,_true>
                  (in_stack_ffffffffffffff60,(mouse_moved *)in_stack_ffffffffffffff58);
      }
    }
    else if (iVar1 == 0x401) {
      if (*(char *)((long)in_RDX + 0x11) != '\x01') {
        __assert_fail("event.button.state == SDL_PRESSED",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jube[P]std_hmi/src/window.cc"
                      ,0x141,
                      "std::optional<window_event> hmi::(anonymous namespace)::translate_event(Uint32, const SDL_Event &)"
                     );
      }
      if (in_RDX[3] == -1) {
        std::
        optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
        ::optional(in_RDI);
      }
      else {
        window_events::mouse_button_pressed::mouse_button_pressed((mouse_button_pressed *)0x107320);
        local_64 = compute_mouse_button((Uint8)local_10[4]);
        vec_accessor<int,_2UL,_0UL>::operator=(&vStack_60,local_10[5]);
        vec_accessor<int,_2UL,_1UL>::operator=
                  ((vec_accessor<int,_2UL,_1UL> *)&vStack_60,local_10[6]);
        std::
        optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
        ::optional<hmi::window_events::mouse_button_pressed,_true>
                  (in_stack_ffffffffffffff60,(mouse_button_pressed *)in_stack_ffffffffffffff58);
      }
    }
    else if (iVar1 == 0x402) {
      if (*(char *)((long)in_RDX + 0x11) != '\0') {
        __assert_fail("event.button.state == SDL_RELEASED",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jube[P]std_hmi/src/window.cc"
                      ,0x14f,
                      "std::optional<window_event> hmi::(anonymous namespace)::translate_event(Uint32, const SDL_Event &)"
                     );
      }
      if (in_RDX[3] == -1) {
        std::
        optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
        ::optional(in_RDI);
      }
      else {
        window_events::mouse_button_released::mouse_button_released
                  ((mouse_button_released *)0x1073d4);
        local_74 = compute_mouse_button((Uint8)local_10[4]);
        vec_accessor<int,_2UL,_0UL>::operator=(&vStack_70,local_10[5]);
        vec_accessor<int,_2UL,_1UL>::operator=
                  ((vec_accessor<int,_2UL,_1UL> *)&vStack_70,local_10[6]);
        std::
        optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
        ::optional<hmi::window_events::mouse_button_released,_true>
                  (in_stack_ffffffffffffff60,(mouse_button_released *)in_stack_ffffffffffffff58);
      }
    }
    else if (iVar1 == 0x403) {
      if (in_RDX[3] == -1) {
        std::
        optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
        ::optional(in_RDI);
      }
      else {
        window_events::mouse_wheel_scrolled::mouse_wheel_scrolled((mouse_wheel_scrolled *)0x107289);
        vec_accessor<int,_2UL,_0UL>::operator=(&local_54,local_10[4]);
        vec_accessor<int,_2UL,_1UL>::operator=((vec_accessor<int,_2UL,_1UL> *)&local_54,local_10[5])
        ;
        std::
        optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
        ::optional<hmi::window_events::mouse_wheel_scrolled,_true>
                  (in_stack_ffffffffffffff60,(mouse_wheel_scrolled *)in_stack_ffffffffffffff58);
      }
    }
    else {
      std::
      optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
      ::optional(in_RDI);
    }
  }
  return in_RDI;
}

Assistant:

std::optional<window_event> translate_event(Uint32 window_id, const SDL_Event& event) {
      switch (event.type) {
        case SDL_WINDOWEVENT:
          if (window_id != event.window.windowID) {
            return std::nullopt;
          }

          switch (event.window.event) {
            case SDL_WINDOWEVENT_SIZE_CHANGED: {
              window_events::resized data;
              data.size.width = event.window.data1;
              data.size.height = event.window.data2;
              return data;
            }

            case SDL_WINDOWEVENT_CLOSE:
              return window_events::closed{};

            case SDL_WINDOWEVENT_FOCUS_GAINED:
              return window_events::focus_gained{};

            case SDL_WINDOWEVENT_FOCUS_LOST:
              return window_events::focus_lost{};

            case SDL_WINDOWEVENT_ENTER:
              return window_events::mouse_entered{};

            case SDL_WINDOWEVENT_LEAVE:
              return window_events::mouse_left{};

            default:
              return std::nullopt;
          }
          break;

        case SDL_QUIT:
          return window_events::closed{};

        case SDL_KEYDOWN:
          assert(event.key.state == SDL_PRESSED);

          if (event.key.repeat == 0) {
            window_events::keyboard_key_pressed data;
            data.keycode = static_cast<keyboard_keycode>(event.key.keysym.sym);
            data.scancode = static_cast<keyboard_scancode>(event.key.keysym.scancode);
            data.modifiers = compute_keyboard_modifiers(event.key.keysym.mod);
            return data;
          } else {
            window_events::keyboard_key_repeated data;
            data.keycode = static_cast<keyboard_keycode>(event.key.keysym.sym);
            data.scancode = static_cast<keyboard_scancode>(event.key.keysym.scancode);
            data.modifiers = compute_keyboard_modifiers(event.key.keysym.mod);
            return data;
          }

          break;

        case SDL_KEYUP: {
          assert(event.key.state == SDL_RELEASED);
          window_events::keyboard_key_released data;
          data.keycode = static_cast<keyboard_keycode>(event.key.keysym.sym);
          data.scancode = static_cast<keyboard_scancode>(event.key.keysym.scancode);
          data.modifiers = compute_keyboard_modifiers(event.key.keysym.mod);
          return data;
        }

        case SDL_MOUSEWHEEL: {
          if (event.wheel.which == SDL_TOUCH_MOUSEID) {
            return std::nullopt;
          }

          window_events::mouse_wheel_scrolled data;
          data.offset.x = event.wheel.x;
          data.offset.y = event.wheel.y;
          return data;
        }

        case SDL_MOUSEBUTTONDOWN: {
          assert(event.button.state == SDL_PRESSED);

          if (event.button.which == SDL_TOUCH_MOUSEID) {
            return std::nullopt;
          }

          window_events::mouse_button_pressed data;
          data.button = compute_mouse_button(event.button.button);
          data.position.x = event.button.x;
          data.position.y = event.button.y;
          return data;
        }

        case SDL_MOUSEBUTTONUP: {
          assert(event.button.state == SDL_RELEASED);

          if (event.button.which == SDL_TOUCH_MOUSEID) {
            return std::nullopt;
          }

          window_events::mouse_button_released data;
          data.button = compute_mouse_button(event.button.button);
          data.position.x = event.button.x;
          data.position.y = event.button.y;
          return data;
        }

        case SDL_MOUSEMOTION: {
          if (event.motion.which == SDL_TOUCH_MOUSEID) {
            return std::nullopt;
          }

          window_events::mouse_moved data;
          data.position.x = event.motion.x;
          data.position.y = event.motion.y;
          return data;
        }

        default:
          break;
      }

      return std::nullopt;
    }